

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

void tcu::anon_unknown_47::computeScaleAndBias
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,Vec4 *scale,
               Vec4 *bias)

{
  float fVar1;
  float *pfVar2;
  float fVar3;
  float local_e0;
  float local_d8;
  int local_90;
  undefined1 local_8c [4];
  int c;
  Vec4 resMax;
  Vec4 resMin;
  Vec4 refMax;
  Vec4 refMin;
  float eps;
  Vec4 maxVal;
  Vec4 minVal;
  Vec4 *bias_local;
  Vec4 *scale_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  
  Vector<float,_4>::Vector((Vector<float,_4> *)(maxVal.m_data + 2));
  Vector<float,_4>::Vector((Vector<float,_4> *)(refMin.m_data + 3));
  refMin.m_data[2] = 0.0001;
  Vector<float,_4>::Vector((Vector<float,_4> *)(refMax.m_data + 2));
  Vector<float,_4>::Vector((Vector<float,_4> *)(resMin.m_data + 2));
  estimatePixelValueRange(reference,(Vec4 *)(refMax.m_data + 2),(Vec4 *)(resMin.m_data + 2));
  maxVal.m_data[2] = refMax.m_data[2];
  maxVal.m_data[3] = refMax.m_data[3];
  refMin.m_data[3] = resMin.m_data[2];
  eps = resMin.m_data[3];
  maxVal.m_data[0] = refMax.m_data[0];
  maxVal.m_data[1] = refMax.m_data[1];
  Vector<float,_4>::Vector((Vector<float,_4> *)(resMax.m_data + 2));
  Vector<float,_4>::Vector((Vector<float,_4> *)local_8c);
  estimatePixelValueRange(result,(Vec4 *)(resMax.m_data + 2),(Vec4 *)local_8c);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),0);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(resMax.m_data + 2),0);
  fVar3 = de::min<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),0);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),1);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(resMax.m_data + 2),1);
  fVar3 = de::min<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),1);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),2);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(resMax.m_data + 2),2);
  fVar3 = de::min<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),2);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),3);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(resMax.m_data + 2),3);
  fVar3 = de::min<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),3);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),0);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_8c,0);
  fVar3 = de::max<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),0);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),1);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_8c,1);
  fVar3 = de::max<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),1);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),2);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_8c,2);
  fVar3 = de::max<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),2);
  *pfVar2 = fVar3;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),3);
  fVar3 = *pfVar2;
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_8c,3);
  fVar3 = de::max<float>(fVar3,*pfVar2);
  pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),3);
  *pfVar2 = fVar3;
  for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
    pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),local_90);
    fVar3 = *pfVar2;
    pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_90);
    if (0.0001 <= fVar3 - *pfVar2) {
      pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),local_90);
      fVar3 = *pfVar2;
      pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_90);
      fVar1 = *pfVar2;
      pfVar2 = Vector<float,_4>::operator[](scale,local_90);
      *pfVar2 = 1.0 / (fVar3 - fVar1);
      pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_90);
      fVar3 = *pfVar2;
      pfVar2 = Vector<float,_4>::operator[](scale,local_90);
      fVar1 = *pfVar2;
      pfVar2 = Vector<float,_4>::operator[](bias,local_90);
      *pfVar2 = -fVar3 * fVar1 + 0.0;
    }
    else {
      pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),local_90);
      if (0.0001 < *pfVar2 || *pfVar2 == 0.0001) {
        pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),local_90);
        local_d8 = 1.0 / *pfVar2;
      }
      else {
        local_d8 = 1.0;
      }
      pfVar2 = Vector<float,_4>::operator[](scale,local_90);
      *pfVar2 = local_d8;
      if (local_90 == 3) {
        pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(refMin.m_data + 3),3);
        fVar3 = *pfVar2;
        pfVar2 = Vector<float,_4>::operator[](scale,3);
        local_e0 = -fVar3 * *pfVar2 + 1.0;
      }
      else {
        pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)(maxVal.m_data + 2),local_90);
        fVar3 = *pfVar2;
        pfVar2 = Vector<float,_4>::operator[](scale,local_90);
        local_e0 = -fVar3 * *pfVar2 + 0.0;
      }
      pfVar2 = Vector<float,_4>::operator[](bias,local_90);
      *pfVar2 = local_e0;
    }
  }
  return;
}

Assistant:

void computeScaleAndBias (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, tcu::Vec4& scale, tcu::Vec4& bias)
{
	Vec4 minVal;
	Vec4 maxVal;
	const float eps = 0.0001f;

	{
		Vec4 refMin;
		Vec4 refMax;
		estimatePixelValueRange(reference, refMin, refMax);

		minVal	= refMin;
		maxVal	= refMax;
	}

	{
		Vec4 resMin;
		Vec4 resMax;

		estimatePixelValueRange(result, resMin, resMax);

		minVal[0] = de::min(minVal[0], resMin[0]);
		minVal[1] = de::min(minVal[1], resMin[1]);
		minVal[2] = de::min(minVal[2], resMin[2]);
		minVal[3] = de::min(minVal[3], resMin[3]);

		maxVal[0] = de::max(maxVal[0], resMax[0]);
		maxVal[1] = de::max(maxVal[1], resMax[1]);
		maxVal[2] = de::max(maxVal[2], resMax[2]);
		maxVal[3] = de::max(maxVal[3], resMax[3]);
	}

	for (int c = 0; c < 4; c++)
	{
		if (maxVal[c] - minVal[c] < eps)
		{
			scale[c]	= (maxVal[c] < eps) ? 1.0f : (1.0f / maxVal[c]);
			bias[c]		= (c == 3) ? (1.0f - maxVal[c]*scale[c]) : (0.0f - minVal[c]*scale[c]);
		}
		else
		{
			scale[c]	= 1.0f / (maxVal[c] - minVal[c]);
			bias[c]		= 0.0f - minVal[c]*scale[c];
		}
	}
}